

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O3

void resize_multistep(uint8_t *input,int length,uint8_t *output,int olength,uint8_t *otmp)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *output_00;
  ulong uVar7;
  int16_t *piVar8;
  uint length_00;
  uint8_t *input_00;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  byte *pbVar12;
  uint8_t uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  byte *pbVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  
  if (length == olength) {
    memcpy(output,input,(long)length);
    return;
  }
  uVar5 = 0;
  iVar2 = length;
  do {
    iVar2 = iVar2 + 1 >> 1;
    if (iVar2 < olength) {
      if (uVar5 == 0) goto LAB_00282836;
      break;
    }
    uVar5 = uVar5 + 1;
  } while (iVar2 != 1);
  iVar2 = length + 1;
  output_00 = (uint8_t *)0x0;
  uVar15 = 0;
  length_00 = length;
  do {
    length = (int)(length_00 + 1) >> 1;
    input_00 = output_00;
    if (uVar15 == 0) {
      input_00 = input;
    }
    output_00 = otmp + (int)(-(uVar15 & 1) & iVar2 >> 1);
    if (length == olength && uVar15 == uVar5 - 1) {
      output_00 = output;
    }
    if ((length_00 & 1) == 0) {
      down2_symeven(input_00,length_00,output_00,0);
    }
    else if ((int)length_00 < 7) {
      if (0 < (int)length_00) {
        uVar19 = 1;
        uVar21 = 0xffffffff;
        uVar9 = 0;
        puVar11 = output_00;
        do {
          iVar14 = (uint)input_00[uVar9] * 0x40 + 0x40;
          lVar16 = 2;
          uVar4 = uVar19;
          uVar6 = uVar21;
          do {
            uVar7 = 0;
            if (0 < (int)uVar6) {
              uVar7 = (ulong)uVar6;
            }
            iVar20 = length_00 - 1;
            if (uVar4 < length_00) {
              iVar20 = (int)uVar4;
            }
            iVar14 = iVar14 + (int)*(short *)((long)av1_down2_symodd_half_filter + lVar16) *
                              ((uint)input_00[iVar20] + (uint)input_00[uVar7]);
            lVar16 = lVar16 + 2;
            uVar4 = uVar4 + 1;
            uVar6 = uVar6 - 1;
          } while (lVar16 != 8);
          iVar20 = iVar14 >> 7;
          if (iVar14 >> 7 < 1) {
            iVar20 = 0;
          }
          uVar13 = (uint8_t)iVar20;
          if (0xfe < iVar20) {
            uVar13 = 0xff;
          }
          *puVar11 = uVar13;
          puVar11 = puVar11 + 1;
          uVar9 = uVar9 + 2;
          uVar19 = uVar19 + 2;
          uVar21 = uVar21 + 2;
        } while (uVar9 < length_00);
      }
    }
    else {
      lVar16 = 0;
      puVar11 = output_00;
      bVar1 = true;
      do {
        bVar3 = bVar1;
        iVar14 = (uint)input_00[lVar16] * 0x40 + 0x40;
        uVar21 = (uint)lVar16;
        lVar17 = 1;
        do {
          uVar21 = uVar21 - 1;
          uVar9 = 0;
          if (0 < (int)uVar21) {
            uVar9 = (ulong)uVar21;
          }
          iVar14 = iVar14 + (int)av1_down2_symodd_half_filter[lVar17] *
                            ((uint)input_00[lVar17 + lVar16] + (uint)input_00[uVar9]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        iVar20 = iVar14 >> 7;
        if (iVar14 >> 7 < 1) {
          iVar20 = 0;
        }
        uVar13 = (uint8_t)iVar20;
        if (0xfe < iVar20) {
          uVar13 = 0xff;
        }
        *puVar11 = uVar13;
        puVar11 = puVar11 + 1;
        lVar16 = 2;
        bVar1 = false;
      } while (bVar3);
      uVar9 = 4;
      if (length_00 - 3 != 4) {
        puVar10 = input_00 + 5;
        pbVar12 = input_00 + 3;
        uVar9 = 4;
        do {
          iVar14 = (uint)input_00[uVar9] * 0x40 + 0x40;
          lVar16 = 0;
          pbVar18 = pbVar12;
          do {
            iVar14 = iVar14 + (int)av1_down2_symodd_half_filter[lVar16 + 1] *
                              ((uint)puVar10[lVar16] + (uint)*pbVar18);
            lVar16 = lVar16 + 1;
            pbVar18 = pbVar18 + -1;
          } while (lVar16 != 3);
          iVar14 = iVar14 >> 7;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          uVar13 = (uint8_t)iVar14;
          if (0xfe < iVar14) {
            uVar13 = 0xff;
          }
          *puVar11 = uVar13;
          puVar11 = puVar11 + 1;
          uVar9 = uVar9 + 2;
          puVar10 = puVar10 + 2;
          pbVar12 = pbVar12 + 2;
        } while (uVar9 < length_00 - 3);
      }
      if ((int)uVar9 < (int)length_00) {
        uVar9 = uVar9 & 0xffffffff;
        uVar19 = uVar9 + 1;
        puVar10 = input_00 + (uVar9 - 1);
        do {
          iVar14 = (uint)input_00[uVar9] * 0x40 + 0x40;
          lVar16 = 3;
          piVar8 = av1_down2_symodd_half_filter;
          uVar4 = uVar19;
          do {
            piVar8 = piVar8 + 1;
            iVar20 = length_00 - 1;
            if (uVar4 < length_00) {
              iVar20 = (int)uVar4;
            }
            iVar14 = iVar14 + (int)*piVar8 * ((uint)input_00[iVar20] + (uint)puVar10[lVar16 + -3]);
            uVar4 = uVar4 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
          iVar20 = iVar14 >> 7;
          if (iVar14 >> 7 < 1) {
            iVar20 = 0;
          }
          uVar13 = (uint8_t)iVar20;
          if (0xfe < iVar20) {
            uVar13 = 0xff;
          }
          *puVar11 = uVar13;
          puVar11 = puVar11 + 1;
          uVar9 = uVar9 + 2;
          uVar19 = uVar19 + 2;
          puVar10 = puVar10 + 2;
        } while ((int)uVar9 < (int)length_00);
      }
    }
    uVar15 = uVar15 + 1;
    length_00 = length;
  } while (uVar15 != uVar5);
  input = output_00;
  if (length == olength) {
    return;
  }
LAB_00282836:
  interpolate(input,length,output,olength);
  return;
}

Assistant:

static void resize_multistep(const uint8_t *const input, int length,
                             uint8_t *output, int olength, uint8_t *otmp) {
  if (length == olength) {
    memcpy(output, input, sizeof(output[0]) * length);
    return;
  }
  const int steps = get_down2_steps(length, olength);

  if (steps > 0) {
    uint8_t *out = NULL;
    int filteredlength = length;

    assert(otmp != NULL);
    uint8_t *otmp2 = otmp + get_down2_length(length, 1);
    for (int s = 0; s < steps; ++s) {
      const int proj_filteredlength = get_down2_length(filteredlength, 1);
      const uint8_t *const in = (s == 0 ? input : out);
      if (s == steps - 1 && proj_filteredlength == olength)
        out = output;
      else
        out = (s & 1 ? otmp2 : otmp);
      if (filteredlength & 1)
        down2_symodd(in, filteredlength, out);
      else
        down2_symeven(in, filteredlength, out, 0);
      filteredlength = proj_filteredlength;
    }
    if (filteredlength != olength) {
      interpolate(out, filteredlength, output, olength);
    }
  } else {
    interpolate(input, length, output, olength);
  }
}